

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

ParseScriptRequest * __thiscall
cfd::js::api::json::ParseScriptRequest::GetScriptString_abi_cxx11_
          (ParseScriptRequest *this,ParseScriptRequest *obj)

{
  ParseScriptRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->script_);
  return this;
}

Assistant:

static std::string GetScriptString(  // line separate
      const ParseScriptRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.script_);
  }